

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSequentialImpulseConstraintSolver.cpp
# Opt level: O3

int __thiscall
btSequentialImpulseConstraintSolver::getOrInitSolverBody
          (btSequentialImpulseConstraintSolver *this,btCollisionObject *body,btScalar timeStep)

{
  void *__src;
  undefined8 *puVar1;
  undefined8 *puVar2;
  btVector3 *pbVar3;
  btScalar *pbVar4;
  float fVar5;
  uint uVar6;
  btSolverBody *pbVar7;
  undefined8 uVar8;
  btMatrix3x3 *pbVar9;
  btSequentialImpulseConstraintSolver *this_00;
  uint uVar10;
  long lVar11;
  int iVar12;
  btSolverBody *local_148;
  btSolverBody *local_140;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [184];
  
  iVar12 = body->m_companionId;
  if (iVar12 < 0) {
    if (((body->m_internalType & 2) != 0) &&
       (((fVar5 = body[1].m_interpolationWorldTransform.m_basis.m_el[0].m_floats[1], fVar5 != 0.0 ||
         (NAN(fVar5))) || ((body->m_collisionFlags & 2) != 0)))) {
      uVar6 = (this->m_tmpSolverBodyPool).m_size;
      memset(local_128,0,0xf8);
      uVar10 = uVar6;
      if (uVar6 == (this->m_tmpSolverBodyPool).m_capacity) {
        iVar12 = 1;
        if (uVar6 != 0) {
          iVar12 = uVar6 * 2;
        }
        if ((int)uVar6 < iVar12) {
          if (iVar12 == 0) {
            local_140 = (btSolverBody *)0x0;
          }
          else {
            local_140 = (btSolverBody *)btAlignedAllocInternal((long)iVar12 * 0xf8,0x10);
            uVar10 = (this->m_tmpSolverBodyPool).m_size;
          }
          if (0 < (int)uVar10) {
            lVar11 = 0;
            do {
              __src = (void *)((long)(((this->m_tmpSolverBodyPool).m_data)->m_deltaLinearVelocity).
                                     m_floats + lVar11);
              uVar8 = *(undefined8 *)((long)__src + -0x38);
              puVar1 = (undefined8 *)
                       ((long)(local_140->m_worldTransform).m_basis.m_el[0].m_floats + lVar11);
              *puVar1 = *(undefined8 *)((long)__src + -0x40);
              puVar1[1] = uVar8;
              uVar8 = *(undefined8 *)((long)__src + -0x28);
              puVar1 = (undefined8 *)
                       ((long)(local_140->m_worldTransform).m_basis.m_el[1].m_floats + lVar11);
              *puVar1 = *(undefined8 *)((long)__src + -0x30);
              puVar1[1] = uVar8;
              uVar8 = *(undefined8 *)((long)__src + -0x18);
              puVar1 = (undefined8 *)
                       ((long)(local_140->m_worldTransform).m_basis.m_el[2].m_floats + lVar11);
              *puVar1 = *(undefined8 *)((long)__src + -0x20);
              puVar1[1] = uVar8;
              uVar8 = *(undefined8 *)((long)__src + -8);
              puVar1 = (undefined8 *)
                       ((long)(local_140->m_worldTransform).m_origin.m_floats + lVar11);
              *puVar1 = *(undefined8 *)((long)__src + -0x10);
              puVar1[1] = uVar8;
              memcpy((void *)((long)(local_140->m_deltaLinearVelocity).m_floats + lVar11),__src,0xb8
                    );
              lVar11 = lVar11 + 0xf8;
            } while ((ulong)uVar10 * 0xf8 - lVar11 != 0);
          }
          pbVar7 = (this->m_tmpSolverBodyPool).m_data;
          if ((pbVar7 != (btSolverBody *)0x0) && ((this->m_tmpSolverBodyPool).m_ownsMemory == true))
          {
            btAlignedFreeInternal(pbVar7);
          }
          (this->m_tmpSolverBodyPool).m_ownsMemory = true;
          (this->m_tmpSolverBodyPool).m_data = local_140;
          (this->m_tmpSolverBodyPool).m_capacity = iVar12;
          uVar10 = (this->m_tmpSolverBodyPool).m_size;
        }
      }
      (this->m_tmpSolverBodyPool).m_size = uVar10 + 1;
      pbVar7 = (this->m_tmpSolverBodyPool).m_data + (int)uVar6;
      this_00 = (btSequentialImpulseConstraintSolver *)&pbVar7->m_deltaLinearVelocity;
      (pbVar7->m_worldTransform).m_basis.m_el[0].m_floats[0] = 0.0;
      (pbVar7->m_worldTransform).m_basis.m_el[0].m_floats[1] = 0.0;
      pbVar9 = &(pbVar7->m_worldTransform).m_basis;
      pbVar9->m_el[0].m_floats[2] = 0.0;
      pbVar9->m_el[0].m_floats[3] = 0.0;
      *(undefined8 *)(pbVar7->m_worldTransform).m_basis.m_el[1].m_floats = local_118;
      *(undefined8 *)((pbVar7->m_worldTransform).m_basis.m_el[1].m_floats + 2) = uStack_110;
      *(undefined8 *)(pbVar7->m_worldTransform).m_basis.m_el[2].m_floats = local_108;
      *(undefined8 *)((pbVar7->m_worldTransform).m_basis.m_el[2].m_floats + 2) = uStack_100;
      *(undefined8 *)(pbVar7->m_worldTransform).m_origin.m_floats = local_f8;
      *(undefined8 *)((pbVar7->m_worldTransform).m_origin.m_floats + 2) = uStack_f0;
      memcpy(this_00,local_e8,0xb8);
      initSolverBody(this_00,(this->m_tmpSolverBodyPool).m_data + (int)uVar6,body,timeStep);
      body->m_companionId = uVar6;
      return uVar6;
    }
    iVar12 = this->m_fixedBodyId;
    if (iVar12 < 0) {
      uVar6 = (this->m_tmpSolverBodyPool).m_size;
      this->m_fixedBodyId = uVar6;
      memset(local_128,0,0xf8);
      uVar10 = uVar6;
      if (uVar6 == (this->m_tmpSolverBodyPool).m_capacity) {
        iVar12 = 1;
        if (uVar6 != 0) {
          iVar12 = uVar6 * 2;
        }
        if ((int)uVar6 < iVar12) {
          if (iVar12 == 0) {
            local_148 = (btSolverBody *)0x0;
          }
          else {
            local_148 = (btSolverBody *)btAlignedAllocInternal((long)iVar12 * 0xf8,0x10);
            uVar10 = (this->m_tmpSolverBodyPool).m_size;
          }
          if (0 < (int)uVar10) {
            lVar11 = 0;
            do {
              puVar1 = (undefined8 *)
                       ((long)(((this->m_tmpSolverBodyPool).m_data)->m_worldTransform).m_basis.m_el
                              [0].m_floats + lVar11);
              uVar8 = puVar1[1];
              puVar2 = (undefined8 *)
                       ((long)(local_148->m_worldTransform).m_basis.m_el[0].m_floats + lVar11);
              *puVar2 = *puVar1;
              puVar2[1] = uVar8;
              uVar8 = puVar1[3];
              puVar2 = (undefined8 *)
                       ((long)(local_148->m_worldTransform).m_basis.m_el[1].m_floats + lVar11);
              *puVar2 = puVar1[2];
              puVar2[1] = uVar8;
              uVar8 = puVar1[5];
              puVar2 = (undefined8 *)
                       ((long)(local_148->m_worldTransform).m_basis.m_el[2].m_floats + lVar11);
              *puVar2 = puVar1[4];
              puVar2[1] = uVar8;
              uVar8 = puVar1[7];
              puVar2 = (undefined8 *)
                       ((long)(local_148->m_worldTransform).m_origin.m_floats + lVar11);
              *puVar2 = puVar1[6];
              puVar2[1] = uVar8;
              memcpy((void *)((long)(local_148->m_deltaLinearVelocity).m_floats + lVar11),puVar1 + 8
                     ,0xb8);
              lVar11 = lVar11 + 0xf8;
            } while ((ulong)uVar10 * 0xf8 - lVar11 != 0);
          }
          pbVar7 = (this->m_tmpSolverBodyPool).m_data;
          if ((pbVar7 != (btSolverBody *)0x0) && ((this->m_tmpSolverBodyPool).m_ownsMemory == true))
          {
            btAlignedFreeInternal(pbVar7);
          }
          (this->m_tmpSolverBodyPool).m_ownsMemory = true;
          (this->m_tmpSolverBodyPool).m_data = local_148;
          (this->m_tmpSolverBodyPool).m_capacity = iVar12;
          uVar10 = (this->m_tmpSolverBodyPool).m_size;
        }
      }
      (this->m_tmpSolverBodyPool).m_size = uVar10 + 1;
      pbVar7 = (this->m_tmpSolverBodyPool).m_data + (int)uVar6;
      (pbVar7->m_worldTransform).m_basis.m_el[0].m_floats[0] = 0.0;
      (pbVar7->m_worldTransform).m_basis.m_el[0].m_floats[1] = 0.0;
      pbVar9 = &(pbVar7->m_worldTransform).m_basis;
      pbVar9->m_el[0].m_floats[2] = 0.0;
      pbVar9->m_el[0].m_floats[3] = 0.0;
      *(undefined8 *)(pbVar7->m_worldTransform).m_basis.m_el[1].m_floats = local_118;
      *(undefined8 *)((pbVar7->m_worldTransform).m_basis.m_el[1].m_floats + 2) = uStack_110;
      *(undefined8 *)(pbVar7->m_worldTransform).m_basis.m_el[2].m_floats = local_108;
      *(undefined8 *)((pbVar7->m_worldTransform).m_basis.m_el[2].m_floats + 2) = uStack_100;
      *(undefined8 *)(pbVar7->m_worldTransform).m_origin.m_floats = local_f8;
      *(undefined8 *)((pbVar7->m_worldTransform).m_origin.m_floats + 2) = uStack_f0;
      memcpy(&pbVar7->m_deltaLinearVelocity,local_e8,0xb8);
      pbVar7 = (this->m_tmpSolverBodyPool).m_data;
      pbVar3 = &pbVar7[(int)uVar6].m_deltaAngularVelocity;
      pbVar3->m_floats[0] = 0.0;
      pbVar3->m_floats[1] = 0.0;
      pbVar3->m_floats[2] = 0.0;
      pbVar3->m_floats[3] = 0.0;
      pbVar3 = &pbVar7[(int)uVar6].m_deltaLinearVelocity;
      pbVar3->m_floats[0] = 0.0;
      pbVar3->m_floats[1] = 0.0;
      pbVar3->m_floats[2] = 0.0;
      pbVar3->m_floats[3] = 0.0;
      pbVar3 = &pbVar7[(int)uVar6].m_pushVelocity;
      pbVar3->m_floats[0] = 0.0;
      pbVar3->m_floats[1] = 0.0;
      pbVar3->m_floats[2] = 0.0;
      pbVar3->m_floats[3] = 0.0;
      pbVar3 = &pbVar7[(int)uVar6].m_turnVelocity;
      pbVar3->m_floats[0] = 0.0;
      pbVar3->m_floats[1] = 0.0;
      pbVar3->m_floats[2] = 0.0;
      pbVar3->m_floats[3] = 0.0;
      pbVar7[(int)uVar6].m_worldTransform.m_basis.m_el[0].m_floats[0] = 1.0;
      pbVar4 = pbVar7[(int)uVar6].m_worldTransform.m_basis.m_el[0].m_floats + 1;
      pbVar4[0] = 0.0;
      pbVar4[1] = 0.0;
      *(undefined8 *)(pbVar4 + 2) = 0;
      pbVar7[(int)uVar6].m_worldTransform.m_basis.m_el[1].m_floats[1] = 1.0;
      pbVar4 = pbVar7[(int)uVar6].m_worldTransform.m_basis.m_el[1].m_floats + 2;
      pbVar4[0] = 0.0;
      pbVar4[1] = 0.0;
      *(undefined8 *)(pbVar4 + 2) = 0;
      pbVar7[(int)uVar6].m_worldTransform.m_basis.m_el[2].m_floats[2] = 1.0;
      pbVar4 = pbVar7[(int)uVar6].m_worldTransform.m_basis.m_el[2].m_floats + 3;
      *(undefined8 *)pbVar4 = 0;
      *(undefined8 *)(pbVar4 + 2) = 0;
      pbVar7[(int)uVar6].m_worldTransform.m_origin.m_floats[3] = 0.0;
      pbVar7[(int)uVar6].m_originalBody = (btRigidBody *)0x0;
      pbVar3 = &pbVar7[(int)uVar6].m_invMass;
      pbVar3->m_floats[0] = 0.0;
      pbVar3->m_floats[1] = 0.0;
      pbVar3->m_floats[2] = 0.0;
      pbVar3->m_floats[3] = 0.0;
      pbVar3 = &pbVar7[(int)uVar6].m_angularFactor;
      pbVar3->m_floats[0] = 1.0;
      pbVar3->m_floats[1] = 1.0;
      pbVar3->m_floats[2] = 1.0;
      pbVar3->m_floats[3] = 0.0;
      pbVar3 = &pbVar7[(int)uVar6].m_linearFactor;
      pbVar3->m_floats[0] = 1.0;
      pbVar3->m_floats[1] = 1.0;
      pbVar3->m_floats[2] = 1.0;
      pbVar3->m_floats[3] = 0.0;
      pbVar3 = &pbVar7[(int)uVar6].m_linearVelocity;
      pbVar3->m_floats[0] = 0.0;
      pbVar3->m_floats[1] = 0.0;
      pbVar3->m_floats[2] = 0.0;
      pbVar3->m_floats[3] = 0.0;
      pbVar3 = &pbVar7[(int)uVar6].m_angularVelocity;
      pbVar3->m_floats[0] = 0.0;
      pbVar3->m_floats[1] = 0.0;
      pbVar3->m_floats[2] = 0.0;
      pbVar3->m_floats[3] = 0.0;
      pbVar3 = &pbVar7[(int)uVar6].m_externalForceImpulse;
      pbVar3->m_floats[0] = 0.0;
      pbVar3->m_floats[1] = 0.0;
      pbVar3->m_floats[2] = 0.0;
      pbVar3->m_floats[3] = 0.0;
      pbVar3 = &pbVar7[(int)uVar6].m_externalTorqueImpulse;
      pbVar3->m_floats[0] = 0.0;
      pbVar3->m_floats[1] = 0.0;
      pbVar3->m_floats[2] = 0.0;
      pbVar3->m_floats[3] = 0.0;
      iVar12 = this->m_fixedBodyId;
    }
  }
  return iVar12;
}

Assistant:

btSingleConstraintRowSolver	btSequentialImpulseConstraintSolver::getSSE2ConstraintRowSolverLowerLimit()
 {
	 return gResolveSingleConstraintRowLowerLimit_sse2;
 }